

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O0

void __thiscall libtorrent::dht::dht_tracker::refresh_key(dht_tracker *this,error_code *e)

{
  dht_observer *pdVar1;
  bool bVar2;
  reference ppVar3;
  size_type sVar4;
  pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node> *n;
  iterator __end2;
  iterator __begin2;
  tracker_nodes_t *__range2;
  undefined1 local_58 [64];
  error_code *local_18;
  error_code *e_local;
  dht_tracker *this_local;
  
  local_18 = e;
  e_local = (error_code *)this;
  bVar2 = boost::system::error_code::operator_cast_to_bool(e);
  if ((!bVar2) && ((this->m_running & 1U) != 0)) {
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::expires_after(&this->m_key_refresh_timer,(duration *)&(anonymous_namespace)::key_refresh);
    local_58._16_8_ = refresh_key;
    local_58._24_8_ = (pointer)0x0;
    self((dht_tracker *)local_58);
    ::std::
    bind<void(libtorrent::dht::dht_tracker::*)(boost::system::error_code_const&),std::shared_ptr<libtorrent::dht::dht_tracker>,std::_Placeholder<1>const&>
              ((type *)(local_58 + 0x20),(offset_in_dht_tracker_to_subr *)(local_58 + 0x10),
               (shared_ptr<libtorrent::dht::dht_tracker> *)local_58,
               (_Placeholder<1> *)&::std::placeholders::_1);
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
    ::
    async_wait<std::_Bind<void(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
              ((basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                *)&this->m_key_refresh_timer,
               (_Bind<void_(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                *)(local_58 + 0x20));
    ::std::
    _Bind<void_(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
    ::~_Bind((_Bind<void_(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
              *)(local_58 + 0x20));
    ::std::shared_ptr<libtorrent::dht::dht_tracker>::~shared_ptr
              ((shared_ptr<libtorrent::dht::dht_tracker> *)local_58);
    __end2 = ::std::
             map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
             ::begin(&this->m_nodes);
    n = (pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>
         *)::std::
           map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
           ::end(&this->m_nodes);
    while (bVar2 = ::std::operator!=(&__end2,(_Self *)&n), bVar2) {
      ppVar3 = ::std::
               _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
               ::operator*(&__end2);
      dht::node::new_write_key(&(ppVar3->second).dht);
      ::std::
      _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
      ::operator++(&__end2);
    }
    pdVar1 = this->m_log;
    sVar4 = ::std::
            map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
            ::size(&this->m_nodes);
    (*(pdVar1->super_dht_logger)._vptr_dht_logger[1])
              (pdVar1,0,"*** new write key*** %d nodes",sVar4 & 0xffffffff);
  }
  return;
}

Assistant:

void dht_tracker::refresh_key(error_code const& e)
	{
		COMPLETE_ASYNC("dht_tracker::refresh_key");
		if (e || !m_running) return;

		ADD_OUTSTANDING_ASYNC("dht_tracker::refresh_key");
		m_key_refresh_timer.expires_after(key_refresh);
		m_key_refresh_timer.async_wait(std::bind(&dht_tracker::refresh_key, self(), _1));

		for (auto& n : m_nodes)
			n.second.dht.new_write_key();

#ifndef TORRENT_DISABLE_LOGGING
		m_log->log(dht_logger::tracker, "*** new write key*** %d nodes"
			, int(m_nodes.size()));
#endif
	}